

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O3

Sample * __thiscall crnlib::Resampler::get_line(Resampler *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  iVar1 = this->m_cur_dst_y;
  if (iVar1 == this->m_resample_dst_y) {
    return (Sample *)0x0;
  }
  uVar2 = (ulong)this->m_Pclist_y[iVar1].n;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if (this->m_Psrc_y_flag[this->m_Pclist_y[iVar1].p[uVar3].pixel] == '\0') {
        return (Sample *)0x0;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  resample_y(this,this->m_Pdst_buf);
  this->m_cur_dst_y = this->m_cur_dst_y + 1;
  return this->m_Pdst_buf;
}

Assistant:

const Resampler::Sample* Resampler::get_line()
    {
        int i;

        /* If all the destination lines have been
      * generated, then always return nullptr.
      */

        if (m_cur_dst_y == m_resample_dst_y)
        {
            return nullptr;
        }

        /* Check to see if all the required
      * contributors are present, if not,
      * return nullptr.
      */

        for (i = 0; i < m_Pclist_y[m_cur_dst_y].n; i++)
        {
            if (!m_Psrc_y_flag[resampler_range_check(m_Pclist_y[m_cur_dst_y].p[i].pixel, m_resample_src_y)])
            {
                return nullptr;
            }
        }

        resample_y(m_Pdst_buf);

        m_cur_dst_y++;

        return m_Pdst_buf;
    }